

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::DetachCurrentThread(TinyGC *this)

{
  mapped_type *ppTVar1;
  key_type local_48 [3];
  key_type local_30;
  mapped_type local_28;
  ThreadState *ts;
  unique_lock<std::mutex> lck;
  TinyGC *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&ts,&this->ts_mxt_);
  local_30._M_thread = (native_handle_type)std::this_thread::get_id();
  ppTVar1 = std::
            unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
            ::operator[](&this->thread_to_stack_,&local_30);
  local_28 = *ppTVar1;
  local_48[0]._M_thread = (native_handle_type)std::this_thread::get_id();
  std::
  unordered_map<std::thread::id,_TinyGC::ThreadState_*,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_TinyGC::ThreadState_*>_>_>
  ::erase(&this->thread_to_stack_,local_48);
  if (local_28 != (mapped_type)0x0) {
    operator_delete(local_28,0x20);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&ts);
  return;
}

Assistant:

void TinyGC::DetachCurrentThread() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  ThreadState *ts = thread_to_stack_[std::this_thread::get_id()];
  thread_to_stack_.erase(std::this_thread::get_id());
  delete ts;
}